

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

size_t utf8spn(void *src,void *accept)

{
  size_t chars;
  char *a;
  char *pcVar1;
  long lVar2;
  
  chars = 0;
LAB_0010f007:
  pcVar1 = (char *)accept;
  if (*src == '\0') {
    return chars;
  }
  do {
    lVar2 = 0;
    while( true ) {
      if (*pcVar1 == '\0') {
        return chars;
      }
      if (lVar2 != 0) {
        chars = chars + 1;
        src = (void *)((long)src + lVar2);
        goto LAB_0010f007;
      }
      if (*pcVar1 != *src) break;
      lVar2 = 1;
      pcVar1 = pcVar1 + 1;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

size_t utf8spn(const void *src, const void *accept) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        // found a match, so increment the number of utf8 codepoints
        // that have matched and stop checking whether any other utf8
        // codepoints in a match
        chars++;
        s += offset;
        break;
      } else {
        if (*a == s[offset]) {
          offset++;
          a++;
        } else {
          // a could be in the middle of an unmatching utf8 codepoint,
          // so we need to march it on to the next character beginning,
          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // if a got to its terminating null byte, then we didn't find a match.
    // Return the current number of matched utf8 codepoints
    if ('\0' == *a) {
      return chars;
    }
  }

  return chars;
}